

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<google::protobuf::internal::Utf8ValidationTest,_testing::internal::TemplateSel<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  type_info *ptVar3;
  _Alloc_hider type_param;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar7;
  size_type *psVar8;
  type_info *ptVar9;
  type_info *ptVar10;
  ulong uVar11;
  allocator<char> local_18a;
  allocator<char> local_189;
  type_info *local_188;
  long local_180;
  type_info local_178;
  undefined7 uStack_177;
  undefined8 uStack_170;
  type_info *local_168;
  long local_160;
  long local_158;
  undefined8 uStack_150;
  string local_148;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  CodeLocation local_c0;
  string local_98;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  int local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_c8 = type_names;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,prefix,&local_18a);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  local_128 = &local_118;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_118 = *plVar7;
    lStack_110 = plVar5[3];
  }
  else {
    local_118 = *plVar7;
    local_128 = (long *)*plVar5;
  }
  local_120 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_108 = &local_f8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_f8 = *plVar7;
    lStack_f0 = plVar5[3];
  }
  else {
    local_f8 = *plVar7;
    local_108 = (long *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_e8 = &local_d8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_d8 = *plVar7;
    lStack_d0 = plVar5[3];
  }
  else {
    local_d8 = *plVar7;
    local_e8 = (long *)*plVar5;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e8,
                              (ulong)(local_c8->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_148.field_2._M_allocated_capacity = *psVar8;
    local_148.field_2._8_8_ = plVar5[3];
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar8;
    local_148._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_148._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar6 = strchr(test_names,0x2c);
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,test_names,&local_189);
  }
  else {
    local_188 = &local_178;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,test_names,pcVar6);
  }
  local_168 = local_188;
  if (local_180 != 0) {
    ptVar9 = local_188 + local_180;
    do {
      ptVar3 = local_188;
      iVar4 = isspace((uint)(byte)ptVar9[-1]);
      local_168 = ptVar3;
      if (iVar4 == 0) break;
      ptVar10 = ptVar9 + -1;
      uVar11 = (long)ptVar10 - (long)ptVar3;
      std::__cxx11::string::_M_erase((ulong)&local_188,uVar11);
      ptVar9 = local_188 + uVar11;
      local_168 = local_188;
    } while (ptVar10 != ptVar3);
  }
  local_188 = &local_178;
  if (local_168 == local_188) {
    uStack_150 = uStack_170;
    local_168 = (type_info *)&local_158;
  }
  ptVar9 = local_168;
  local_158 = CONCAT71(uStack_177,local_178);
  local_160 = local_180;
  local_180 = 0;
  local_178 = (type_info)0x0;
  GetTypeName_abi_cxx11_(&local_98,(internal *)&proto2_unittest::TestAllTypes::typeinfo,local_188);
  type_param._M_p = local_98._M_dataplus._M_p;
  paVar1 = &local_c0.file.field_2;
  pcVar2 = (code_location->file)._M_dataplus._M_p;
  local_c0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + (code_location->file)._M_string_length);
  local_c0.line = code_location->line;
  set_up_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String<proto2_unittest::TestAllTypes>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_c0.line);
  tear_down_tc = SuiteApiResolver<google::protobuf::internal::gtest_suite_Utf8ValidationTest_::ReadInvalidUTF8String<proto2_unittest::TestAllTypes>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_01925070;
  MakeAndRegisterTestInfo
            (&local_148,(char *)ptVar9,type_param._M_p,(char *)0x0,&local_c0,
             &TypeIdHelper<google::protobuf::internal::Utf8ValidationTest<proto2_unittest::TestAllTypes>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.file._M_dataplus._M_p,local_c0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_168 != (type_info *)&local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_78 = (size_type *)(code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78 == paVar1) {
    local_68 = paVar1->_M_allocated_capacity;
    uStack_60 = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_78 = &local_68;
  }
  else {
    local_68 = paVar1->_M_allocated_capacity;
  }
  local_70 = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_58 = code_location->line;
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }